

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.cpp
# Opt level: O2

void __thiscall
duckdb::MemoryStream::ReadData(MemoryStream *this,data_ptr_t destination,idx_t read_size)

{
  SerializationException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->position + read_size <= this->capacity) {
    switchD_01939fa4::default(destination,this->data + this->position,read_size);
    this->position = this->position + read_size;
    return;
  }
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "Failed to deserialize: not enough data in buffer to fulfill read request",&local_39);
  SerializationException::SerializationException(this_00,&local_38);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void MemoryStream::ReadData(data_ptr_t destination, idx_t read_size) {
	if (position + read_size > capacity) {
		throw SerializationException("Failed to deserialize: not enough data in buffer to fulfill read request");
	}
	memcpy(destination, data + position, read_size);
	position += read_size;
}